

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O1

string * __thiscall
benchmark::GetBigOString_abi_cxx11_(string *__return_storage_ptr__,benchmark *this,BigO complexity)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "(1)";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "N";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "N^2";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "N^3";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "lgN";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "NlgN";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "f(N)";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBigOString(BigO complexity) {
  switch (complexity) {
    case oN:
      return "N";
    case oNSquared:
      return "N^2";
    case oNCubed:
      return "N^3";
    case oLogN:
      return "lgN";
    case oNLogN:
      return "NlgN";
    case o1:
      return "(1)";
    default:
      return "f(N)";
  }
}